

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  int iVar7;
  unsigned_long_long uVar8;
  unsigned_long_long uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [64];
  float fVar23;
  float fVar24;
  float zero_deadzone_halfsize;
  undefined1 extraout_var [56];
  
  pIVar6 = GImGui;
  lVar12 = v_min - v_max;
  if (v_min < v_max) {
    lVar12 = -(v_min - v_max);
  }
  uVar11 = flags & 0x100000;
  uVar10 = data_type & 0xfffffffe;
  fVar24 = *(float *)((long)&(bb->Min).x + (ulong)(uVar11 >> 0x12));
  fVar21 = *(float *)((long)&(bb->Max).x + (ulong)(uVar11 >> 0x12));
  fVar2 = (fVar21 - fVar24) + -4.0;
  fVar15 = (GImGui->Style).GrabMinSize;
  if (-1 < lVar12 && uVar10 != 8) {
    fVar23 = fVar2 / (float)(lVar12 + 1);
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)fVar23),2);
    bVar13 = (bool)((byte)uVar4 & 1);
    fVar15 = (float)((uint)bVar13 * (int)fVar23 + (uint)!bVar13 * (int)fVar15);
  }
  auVar3 = vminss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar2));
  fVar15 = fVar2 - auVar3._0_4_;
  zero_deadzone_halfsize = 0.0;
  fVar23 = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar10 == 8) {
      iVar7 = ImParseFormatPrecision(format,3);
      fVar23 = (float)iVar7;
    }
    else {
      fVar23 = 1.0;
    }
    fVar23 = powf(0.1,fVar23);
    auVar17 = vmaxss_avx(ZEXT416((uint)fVar15),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar6->Style).LogSliderDeadzone * 0.5) / auVar17._0_4_;
  }
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 + 2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0));
  fVar24 = auVar17._0_4_;
  if (pIVar6->ActiveId != id) {
    bVar13 = false;
    goto LAB_00303a4e;
  }
  if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar6->ActiveIdIsJustActivated == true) {
      pIVar6->SliderCurrentAccum = 0.0;
      pIVar6->SliderCurrentAccumDirty = false;
    }
    auVar22._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    auVar22._8_56_ = extraout_var;
    auVar17 = vmovshdup_avx(auVar22._0_16_);
    auVar18._8_4_ = 0x80000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar18._12_4_ = 0x80000000;
    auVar17 = vxorps_avx512vl(auVar17,auVar18);
    auVar17._0_4_ =
         (float)((uint)(uVar11 == 0) * (int)auVar22._0_4_ + (uint)(uVar11 != 0) * auVar17._0_4_);
    if ((auVar17._0_4_ != 0.0) || (NAN(auVar17._0_4_))) {
      if ((uVar10 == 8) && (iVar7 = ImParseFormatPrecision(format,3), 0 < iVar7)) {
        uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
        bVar13 = (bool)((byte)uVar4 & 1);
        fVar15 = (float)((uint)bVar13 * (int)((auVar17._0_4_ / 100.0) / 10.0) +
                        (uint)!bVar13 * (int)(auVar17._0_4_ / 100.0));
      }
      else if ((lVar12 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
        uVar4 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,1);
        bVar13 = (bool)((byte)uVar4 & 1);
        fVar15 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * 0x3f800000) / (float)lVar12;
      }
      else {
        fVar15 = auVar17._0_4_ / 100.0;
      }
      uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
      bVar13 = (bool)((byte)uVar4 & 1);
      pIVar6->SliderCurrentAccum =
           (float)((uint)bVar13 * (int)(fVar15 * 10.0) + (uint)!bVar13 * (int)fVar15) +
           pIVar6->SliderCurrentAccum;
      pIVar6->SliderCurrentAccumDirty = true;
    }
    fVar15 = pIVar6->SliderCurrentAccum;
    if ((pIVar6->NavActivatePressedId == id) && (pIVar6->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar6->SliderCurrentAccumDirty == true) {
      uVar10 = (flags & 0x20U) >> 5;
      bVar13 = SUB41(uVar10,0);
      fVar19 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         (data_type,*v,v_min,v_max,bVar13,fVar23,zero_deadzone_halfsize);
      fVar16 = fVar19;
      if ((fVar19 < 1.0) || (fVar15 <= 0.0)) {
        fVar20 = 0.0;
        if ((0.0 < fVar19) || (0.0 <= fVar15)) {
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar15 + fVar19)));
          uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar15 + fVar19)),ZEXT816(0),1);
          fVar16 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar17._0_4_);
          uVar9 = (unsigned_long_long)uVar10;
          uVar8 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                            (data_type,fVar16,v_min,v_max,bVar13,fVar23,zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            uVar8 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                              ((ImGui *)format,(char *)(ulong)(uint)data_type,(ImGuiDataType)uVar8,
                               uVar9);
          }
          fVar20 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                             (data_type,uVar8,v_min,v_max,bVar13,fVar23,zero_deadzone_halfsize);
          fVar20 = fVar20 - fVar19;
          if (fVar15 <= 0.0) {
            uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT416((uint)fVar20),2);
            bVar13 = (bool)((byte)uVar4 & 1);
            fVar20 = (float)((uint)bVar13 * (int)fVar20 + (uint)!bVar13 * (int)fVar15);
          }
          else {
            auVar17 = vminss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar15));
            fVar20 = auVar17._0_4_;
          }
          fVar20 = pIVar6->SliderCurrentAccum - fVar20;
          bVar13 = true;
        }
        else {
          bVar13 = false;
        }
      }
      else {
        bVar13 = false;
        fVar20 = 0.0;
      }
      pIVar6->SliderCurrentAccum = fVar20;
      pIVar6->SliderCurrentAccumDirty = false;
      goto LAB_003039d2;
    }
    bVar13 = false;
    fVar16 = 0.0;
  }
  else {
    fVar16 = 0.0;
    if (pIVar6->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar6->IO).MouseDown[0] == false) {
        ClearActiveID();
        fVar16 = 0.0;
        bVar13 = false;
      }
      else {
        fVar16 = 0.0;
        if (0.0 < fVar15) {
          auVar18 = ZEXT416((uint)((*(float *)((pIVar6->IO).MouseDown +
                                              (ulong)(uVar11 >> 0x14) * 4 + -8) - fVar24) / fVar15))
          ;
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar18);
          uVar4 = vcmpss_avx512f(auVar18,ZEXT816(0) << 0x40,1);
          fVar16 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar17._0_4_);
        }
        fVar16 = (float)((uint)(uVar11 == 0) * (int)fVar16 +
                        (uint)(uVar11 != 0) * (int)(1.0 - fVar16));
        bVar13 = true;
      }
    }
    else {
      bVar13 = false;
    }
  }
LAB_003039d2:
  if (bVar13) {
    uVar10 = (flags & 0x20U) >> 5;
    uVar9 = (unsigned_long_long)uVar10;
    uVar8 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                      (data_type,fVar16,v_min,v_max,SUB41(uVar10,0),fVar23,zero_deadzone_halfsize);
    if ((flags & 0x40U) == 0) {
      uVar8 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,(ImGuiDataType)uVar8,uVar9);
    }
    bVar13 = *v != uVar8;
    if (bVar13) {
      *v = uVar8;
      bVar13 = true;
    }
  }
  else {
    bVar13 = false;
  }
LAB_00303a4e:
  if (1.0 <= fVar2) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(auVar3,auVar5);
    auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar21 + -2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0))
    ;
    fVar21 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar23,
                        zero_deadzone_halfsize);
    bVar14 = uVar11 == 0;
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)(auVar17._0_4_ - fVar24)),
                              ZEXT416((uint)bVar14 * (int)fVar21 +
                                      (uint)!bVar14 * (int)(1.0 - fVar21)),ZEXT416((uint)fVar24));
    if (bVar14) {
      auVar18 = vfmadd213ss_fma(auVar18,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      fVar24 = (bb->Min).y;
      fVar21 = (bb->Max).y;
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      (out_grab_bb->Min).x = auVar18._0_4_;
      (out_grab_bb->Min).y = fVar24 + 2.0;
      (out_grab_bb->Max).x = auVar3._0_4_;
      (out_grab_bb->Max).y = fVar21 + -2.0;
    }
    else {
      fVar24 = (bb->Max).x;
      auVar18 = vfmadd213ss_fma(auVar18,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar18._0_4_;
      (out_grab_bb->Max).x = fVar24 + -2.0;
      (out_grab_bb->Max).y = auVar3._0_4_;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar13;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}